

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

bool anon_unknown.dwarf_36ccdf::needToQuoteTestName(cmMakefile *mf,string *name)

{
  string *this;
  PolicyStatus PVar1;
  undefined1 auVar2 [12];
  string local_60;
  string local_40;
  string *local_20;
  string *name_local;
  cmMakefile *mf_local;
  
  local_20 = name;
  name_local = (string *)mf;
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0110,false);
  if (PVar1 != OLD) {
    if (PVar1 != WARN) {
      return true;
    }
    auVar2 = std::__cxx11::string::find_first_of((char *)local_20,0xff9ff0);
    this = name_local;
    if (auVar2._0_8_ != -1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_60,(cmPolicies *)0x6e,auVar2._8_4_);
      cmStrCat<std::__cxx11::string,char_const(&)[92],std::__cxx11::string_const&,char_const(&)[4]>
                (&local_40,&local_60,
                 (char (*) [92])
                 "\nThe following name given to add_test() is invalid if CMP0110 is not set or set to OLD:\n  `"
                 ,local_20,&anon_var_dwarf_364100);
      cmMakefile::IssueMessage((cmMakefile *)this,AUTHOR_WARNING,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return false;
}

Assistant:

bool needToQuoteTestName(const cmMakefile& mf, const std::string& name)
{
  // Determine if policy CMP0110 is set to NEW.
  switch (mf.GetPolicyStatus(cmPolicies::CMP0110)) {
    case cmPolicies::WARN:
      // Only warn if a forbidden character is used in the name.
      if (name.find_first_of("$[] #;\t\n\"\\") != std::string::npos) {
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0110),
                   "\nThe following name given to add_test() is invalid if "
                   "CMP0110 is not set or set to OLD:\n  `",
                   name, "´\n"));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to not quote the test's name.
      return false;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
    default:
      // NEW behavior is to quote the test's name.
      return true;
  }
}